

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_parser.cpp
# Opt level: O0

void ParseSingleFile(char *filename,int lump,void *parser,ZCCParseState *state)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ZCCToken yyminor;
  ZCCToken yyminor_00;
  undefined1 local_168 [16];
  TokenMapEntry *zcctoken;
  undefined4 local_150;
  undefined1 local_140 [8];
  FScanner sc;
  ZCCToken value;
  int tokentype;
  ZCCParseState *state_local;
  void *parser_local;
  int lump_local;
  char *filename_local;
  
  FScanner::FScanner((FScanner *)local_140);
  if (filename == (char *)0x0) {
    FScanner::OpenLumpNum((FScanner *)local_140,lump);
  }
  else {
    iVar2 = FWadCollection::CheckNumForFullName(&Wads,filename,true,0);
    if (iVar2 < 0) {
      Printf("Could not find script lump \'%s\'\n",filename);
      local_150 = 1;
      goto LAB_007dbdf1;
    }
    FScanner::OpenLumpNum((FScanner *)local_140,iVar2);
  }
  state->sc = (FScanner *)local_140;
  while (bVar1 = FScanner::GetToken((FScanner *)local_140), bVar1) {
    value.field_0.Int = FScanner::GetMessageLine((FScanner *)local_140);
    switch(sc.String._4_4_) {
    case 0x101:
      FName::FName((FName *)((long)&zcctoken + 4),(char *)local_140);
      iVar2 = FName::operator_cast_to_int((FName *)((long)&zcctoken + 4));
      sc.LastGotLine = iVar2;
      value._12_4_ = 0x36;
      break;
    case 0x102:
      sc._248_8_ = FSharedStringArena::Alloc
                             ((FSharedStringArena *)state,(char *)local_140,(long)(int)sc.String);
      value._12_4_ = 0x52;
      break;
    case 0x103:
      iVar2 = FName::operator_cast_to_int((FName *)&sc.Float);
      sc.LastGotLine = iVar2;
      value._12_4_ = 0x80;
      break;
    case 0x104:
      sc.LastGotLine = sc.StringLen;
      value._12_4_ = 0x7d;
      break;
    case 0x105:
      sc.LastGotLine = sc.StringLen;
      value._12_4_ = 0x7e;
      break;
    case 0x106:
      sc.LastGotLine = sc.Number;
      sc.CMode = (bool)sc._20_1_;
      sc.StateMode = sc._21_1_;
      sc.StateOptions = (bool)sc._22_1_;
      sc.Escape = (bool)sc._23_1_;
      value._12_4_ = 0x7f;
      break;
    case 0x107:
      FName::FName((FName *)&zcctoken,(char *)local_140);
      iVar2 = FName::operator_cast_to_int((FName *)&zcctoken);
      sc.LastGotLine = iVar2;
      value._12_4_ = 0x44;
      break;
    default:
      local_168._8_8_ =
           TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::CheckKey
                     (&TokenMap,sc.String._4_2_);
      if ((TokenMapEntry *)local_168._8_8_ == (TokenMapEntry *)0x0) {
        FScanner::TokenName((FScanner *)local_168,sc.String._4_4_,(char *)0x0);
        pcVar3 = FString::GetChars((FString *)local_168);
        FScanner::ScriptMessage((FScanner *)local_140,"Unexpected token %s.\n",pcVar3);
        FString::~FString((FString *)local_168);
        goto LAB_007dbda5;
      }
      value._12_4_ = SEXT24(((TokenMapEntry *)local_168._8_8_)->TokenType);
      sc.LastGotLine = (uint)((TokenMapEntry *)local_168._8_8_)->TokenName;
    }
    yyminor.SourceLoc = value.field_0.Int;
    yyminor.field_0 = (anon_union_8_3_77c0fe9c_for_ZCCToken_0)sc._248_8_;
    yyminor._12_4_ = 0;
    ZCCParse(parser,value._12_4_,yyminor,state);
  }
LAB_007dbda5:
  sc.LastGotLine = -1;
  yyminor_00.SourceLoc = value.field_0.Int;
  yyminor_00.field_0 = (anon_union_8_3_77c0fe9c_for_ZCCToken_0)sc._248_8_;
  yyminor_00._12_4_ = 0;
  ZCCParse(parser,0x30,yyminor_00,state);
  state->sc = (FScanner *)0x0;
  local_150 = 0;
LAB_007dbdf1:
  FScanner::~FScanner((FScanner *)local_140);
  return;
}

Assistant:

static void ParseSingleFile(const char *filename, int lump, void *parser, ZCCParseState &state)
{
	int tokentype;
	//bool failed;
	ZCCToken value;
	FScanner sc;

	if (filename != nullptr)
	{
		lump = Wads.CheckNumForFullName(filename, true);
		if (lump >= 0)
		{
			sc.OpenLumpNum(lump);
		}
		else
		{
			Printf("Could not find script lump '%s'\n", filename);
			return;
		}
	}
	else sc.OpenLumpNum(lump);

	state.sc = &sc;
	while (sc.GetToken())
	{
		value.SourceLoc = sc.GetMessageLine();
		switch (sc.TokenType)
		{
		case TK_StringConst:
			value.String = state.Strings.Alloc(sc.String, sc.StringLen);
			tokentype = ZCC_STRCONST;
			break;

		case TK_NameConst:
			value.Int = sc.Name;
			tokentype = ZCC_NAMECONST;
			break;

		case TK_IntConst:
			value.Int = sc.Number;
			tokentype = ZCC_INTCONST;
			break;

		case TK_UIntConst:
			value.Int = sc.Number;
			tokentype = ZCC_UINTCONST;
			break;

		case TK_FloatConst:
			value.Float = sc.Float;
			tokentype = ZCC_FLOATCONST;
			break;

		case TK_Identifier:
			value.Int = FName(sc.String);
			tokentype = ZCC_IDENTIFIER;
			break;

		case TK_NonWhitespace:
			value.Int = FName(sc.String);
			tokentype = ZCC_NWS;
			break;

		default:
			TokenMapEntry *zcctoken = TokenMap.CheckKey(sc.TokenType);
			if (zcctoken != nullptr)
			{
				tokentype = zcctoken->TokenType;
				value.Int = zcctoken->TokenName;
			}
			else
			{
				sc.ScriptMessage("Unexpected token %s.\n", sc.TokenName(sc.TokenType).GetChars());
				goto parse_end;
			}
			break;
		}
		ZCCParse(parser, tokentype, value, &state);
	}
parse_end:
	value.Int = -1;
	ZCCParse(parser, ZCC_EOF, value, &state);
	state.sc = nullptr;
}